

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::DescriptorBuilder::AllocateNameString
          (DescriptorBuilder *this,string *scope,string *proto_name)

{
  string *psVar1;
  AlphaNum *in_R8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  pointer local_48;
  size_type local_40;
  
  if (scope->_M_string_length != 0) {
    psVar1 = DescriptorPool::Tables::AllocateEmptyString_abi_cxx11_(this->tables_);
    local_48 = (scope->_M_dataplus)._M_p;
    local_40 = scope->_M_string_length;
    local_78.piece_data_ = ".";
    local_78.piece_size_ = 1;
    local_a8.piece_data_ = (proto_name->_M_dataplus)._M_p;
    local_a8.piece_size_ = proto_name->_M_string_length;
    StrCat_abi_cxx11_(&local_c8,(protobuf *)&local_48,&local_78,&local_a8,in_R8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    return psVar1;
  }
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,proto_name);
  return psVar1;
}

Assistant:

std::string* DescriptorBuilder::AllocateNameString(
    const std::string& scope, const std::string& proto_name) {
  std::string* full_name;
  if (scope.empty()) {
    full_name = tables_->AllocateString(proto_name);
  } else {
    full_name = tables_->AllocateEmptyString();
    *full_name = StrCat(scope, ".", proto_name);
  }
  return full_name;
}